

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

int Saig_SynchCountX(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int *piPat)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  void *__ptr;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  __ptr = calloc((long)(nWords << 4),4);
  iVar11 = pAig->nRegs;
  if (0 < (long)iVar11) {
    pVVar4 = pAig->vCos;
    iVar2 = pAig->nTruePos;
    lVar9 = 0;
    do {
      if ((iVar2 < 0) || (lVar6 = lVar9 + iVar2, pVVar4->nSize <= lVar6)) {
LAB_006fe62f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar7 = *(int *)((long)pVVar4->pArray[lVar6] + 0x24);
      if (((long)iVar7 < 0) || (vSimInfo->nSize <= iVar7)) goto LAB_006fe62f;
      if (0 < nWords) {
        pvVar5 = vSimInfo->pArray[iVar7];
        uVar10 = 0;
        do {
          uVar3 = *(uint *)((long)pvVar5 + uVar10 * 4);
          lVar6 = 0;
          do {
            if ((~(uVar3 >> ((byte)lVar6 & 0x1f)) & 3) == 0) {
              piVar1 = (int *)((long)__ptr + lVar6 * 2 + (ulong)((uint)uVar10 & 0xfffffff) * 0x40);
              *piVar1 = *piVar1 + 1;
            }
            lVar6 = lVar6 + 2;
          } while (lVar6 != 0x20);
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)nWords);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar11);
  }
  iVar11 = iVar11 + 1;
  if (nWords < 1) {
    iVar7 = -1;
    iVar2 = -1;
    if (__ptr == (void *)0x0) goto LAB_006fe61b;
  }
  else {
    uVar8 = 0xffffffff;
    uVar10 = 0;
    do {
      iVar2 = *(int *)((long)__ptr + uVar10 * 4);
      if (iVar2 < iVar11) {
        if (iVar2 == 0) {
          iVar11 = 0;
          iVar2 = (int)uVar10;
          break;
        }
        uVar8 = uVar10 & 0xffffffff;
        iVar11 = iVar2;
      }
      uVar10 = uVar10 + 1;
      iVar2 = (int)uVar8;
    } while ((uint)(nWords << 4) != uVar10);
  }
  iVar7 = iVar2;
  free(__ptr);
LAB_006fe61b:
  *piPat = iVar7;
  return iVar11;
}

Assistant:

int Saig_SynchCountX( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int * piPat )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int * pCounters, i, w, b;
    int iPatBest, iTernMin;
    // count the number of ternary values in each pattern
    pCounters = ABC_CALLOC( int, nWords * 16 );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            for ( b = 0; b < 16; b++ )
                if ( ((pSim[w] >> (b << 1)) & 3) == 3 )
                    pCounters[16 * w + b]++;
    }
    // get the best pattern
    iPatBest = -1;
    iTernMin = 1 + Saig_ManRegNum(pAig);
    for ( b = 0; b < 16 * nWords; b++ )
        if ( iTernMin > pCounters[b] )
        {
            iTernMin = pCounters[b];
            iPatBest = b;
            if ( iTernMin == 0 )
                break;
        }
    ABC_FREE( pCounters );
    *piPat = iPatBest;
    return iTernMin;
}